

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

Debug * __thiscall Corrade::Utility::Debug::print<double>(Debug *this,double *value)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  Error local_48;
  
  poVar2 = this->_output;
  if (poVar2 != (ostream *)0x0) {
    __s = this->_sourceLocationFile;
    if (__s != (char *)0x0) {
      if (((this->_immediateFlags)._value & 4) == 0) {
        local_48.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
        local_48.super_Debug._flags._value = '\0';
        local_48.super_Debug._immediateFlags._value = '\x04';
        local_48.super_Debug._internalFlags._value = 0;
        local_48.super_Debug._sourceLocationLine = 0;
        local_48.super_Debug._sourceLocationFile = (char *)0x0;
        local_48.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
        if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
          local_48.super_Debug._internalFlags._value = 8;
        }
        if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
          local_48.super_Debug._internalFlags._value =
               local_48.super_Debug._internalFlags._value | 0x10;
        }
        local_48._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
        local_48.super_Debug._output = (ostream *)&std::cerr;
        *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
        operator<<(&local_48.super_Debug,
                   "Assertion _immediateFlags & Flag::NoSpace failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:700"
                  );
        Error::~Error(&local_48);
        abort();
      }
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_sourceLocationLine);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      this->_sourceLocationFile = (char *)0x0;
    }
    if ((((this->_immediateFlags)._value | (this->_flags)._value) & 4) == 0) {
      local_48.super_Debug._output = (ostream *)CONCAT71(local_48.super_Debug._output._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(this->_output,(char *)&local_48,1);
    }
    std::ostream::_M_insert<double>(*value);
    (this->_immediateFlags)._value = '\0';
    (this->_internalFlags)._value = (this->_internalFlags)._value | 2;
  }
  return this;
}

Assistant:

Debug& Debug::print(const T& value) {
    if(!_output) return *this;

    #ifdef CORRADE_SOURCE_LOCATION_BUILTINS_SUPPORTED
    /* Print source location, if not printed yet */
    if(_sourceLocationFile) {
        CORRADE_INTERNAL_ASSERT(_immediateFlags & Flag::NoSpace);
        *_output << _sourceLocationFile << ":" << _sourceLocationLine << ": ";
        _sourceLocationFile = nullptr;
    }
    #endif

    /* Separate values with spaces if enabled */
    if(!((_immediateFlags|_flags) & Flag::NoSpace))
        *_output << ' ';
    /* Print the next value as hexadecimal if enabled */
    /** @todo this does strange crap for negative values (printing them as
        unsigned), revisit once iostreams are not used anymore */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << "0x" << std::hex;

    toStream(*_output, value);

    /* Reset the hexadecimal printing back if it was enabled */
    if(((_immediateFlags|_flags) & Flag::Hex) && std::is_integral<T>::value)
        *_output << std::dec;

    /* Reset all immediate flags after */
    _immediateFlags = {};

    _internalFlags |= InternalFlag::ValueWritten;
    return *this;
}